

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O2

void rlActiveDrawBuffers(int count)

{
  char *text;
  uint buffers [8];
  
  if (count < 1) {
    text = "GL: One color buffer active by default";
  }
  else {
    if ((uint)count < 9) {
      buffers[4] = 0x8ce4;
      buffers[5] = 0x8ce5;
      buffers[6] = 0x8ce6;
      buffers[7] = 0x8ce7;
      buffers[0] = 0x8ce0;
      buffers[1] = 0x8ce1;
      buffers[2] = 0x8ce2;
      buffers[3] = 0x8ce3;
      (*glad_glDrawBuffers)(count,buffers);
      return;
    }
    text = "GL: Max color buffers limited to 8";
  }
  TraceLog(4,text);
  return;
}

Assistant:

void rlActiveDrawBuffers(int count)
{
#if ((defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES3)) && defined(RLGL_RENDER_TEXTURES_HINT))
    // NOTE: Maximum number of draw buffers supported is implementation dependant,
    // it can be queried with glGet*() but it must be at least 8
    //GLint maxDrawBuffers = 0;
    //glGetIntegerv(GL_MAX_DRAW_BUFFERS, &maxDrawBuffers);

    if (count > 0)
    {
        if (count > 8) TRACELOG(LOG_WARNING, "GL: Max color buffers limited to 8");
        else
        {
            unsigned int buffers[8] = {
#if defined(GRAPHICS_API_OPENGL_ES3)
                GL_COLOR_ATTACHMENT0_EXT,
                GL_COLOR_ATTACHMENT1_EXT,
                GL_COLOR_ATTACHMENT2_EXT,
                GL_COLOR_ATTACHMENT3_EXT,
                GL_COLOR_ATTACHMENT4_EXT,
                GL_COLOR_ATTACHMENT5_EXT,
                GL_COLOR_ATTACHMENT6_EXT,
                GL_COLOR_ATTACHMENT7_EXT,
#else
                GL_COLOR_ATTACHMENT0,
                GL_COLOR_ATTACHMENT1,
                GL_COLOR_ATTACHMENT2,
                GL_COLOR_ATTACHMENT3,
                GL_COLOR_ATTACHMENT4,
                GL_COLOR_ATTACHMENT5,
                GL_COLOR_ATTACHMENT6,
                GL_COLOR_ATTACHMENT7,
#endif
            };

#if defined(GRAPHICS_API_OPENGL_ES3)
            glDrawBuffersEXT(count, buffers);
#else
            glDrawBuffers(count, buffers);
#endif
        }
    }
    else TRACELOG(LOG_WARNING, "GL: One color buffer active by default");
#endif
}